

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

OPJ_BOOL opj_t2_encode_packet
                   (OPJ_UINT32 tileno,opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,
                   OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 length,
                   opj_codestream_info_t *cstr_info,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  uint uVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_tcd_cblk_enc_t *poVar5;
  opj_packet_info_t *poVar6;
  int iVar7;
  OPJ_BOOL OVar8;
  uint uVar9;
  OPJ_INT32 OVar10;
  OPJ_INT32 OVar11;
  opj_bio_t *bio;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  OPJ_UINT32 OVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 OVar17;
  OPJ_UINT32 OVar18;
  uint uVar19;
  opj_tcd_layer_t *poVar20;
  opj_tcd_band_t *band;
  int iVar21;
  byte *pbVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  OPJ_UINT32 *pOVar26;
  uint uVar27;
  bool bVar28;
  double dVar29;
  OPJ_BYTE *local_c8;
  opj_tcd_cblk_enc_t *local_b0;
  int local_78;
  opj_tcd_band_t *local_70;
  opj_tcd_band_t *local_68;
  
  uVar1 = pi->resno;
  uVar2 = pi->precno;
  uVar19 = pi->layno;
  uVar13 = (ulong)uVar19;
  poVar3 = tile->comps[pi->compno].resolutions;
  local_c8 = dest;
  if ((tcp->csty & 2) != 0) {
    if (length < 6) {
      if (p_t2_mode != FINAL_PASS) {
        return 0;
      }
      uVar12 = 6;
      uVar14 = (ulong)length;
      goto LAB_00131d34;
    }
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    dest[4] = *(OPJ_BYTE *)((long)&tile->packno + 1);
    dest[5] = (OPJ_BYTE)tile->packno;
    length = length - 6;
    local_c8 = dest + 6;
  }
  if (uVar13 == 0) {
    band = poVar3[uVar1].bands;
    for (uVar23 = 0; uVar23 < poVar3[uVar1].numbands; uVar23 = uVar23 + 1) {
      OVar8 = opj_tcd_is_band_empty(band);
      if (OVar8 == 0) {
        poVar4 = band->precincts;
        opj_tgt_reset(poVar4[uVar2].incltree);
        opj_tgt_reset(poVar4[uVar2].imsbtree);
        OVar15 = poVar4[uVar2].ch;
        OVar17 = poVar4[uVar2].cw;
        lVar25 = 0x34;
        for (uVar12 = 0; OVar15 * OVar17 != uVar12; uVar12 = uVar12 + 1) {
          poVar5 = poVar4[uVar2].cblks.enc;
          *(undefined4 *)((long)&poVar5->data + lVar25) = 0;
          opj_tgt_setvalue(poVar4[uVar2].imsbtree,(OPJ_UINT32)uVar12,
                           band->numbps - *(int *)((long)poVar5 + lVar25 + -0xc));
          lVar25 = lVar25 + 0x40;
        }
      }
      band = band + 1;
    }
  }
  bio = opj_bio_create();
  if (bio != (opj_bio_t *)0x0) {
    opj_bio_init_enc(bio,local_c8,length);
    opj_bio_write(bio,1,1);
    local_70 = poVar3[uVar1].bands;
    local_68 = local_70;
    for (uVar23 = 0; uVar23 < poVar3[uVar1].numbands; uVar23 = uVar23 + 1) {
      OVar8 = opj_tcd_is_band_empty(local_68);
      if (OVar8 == 0) {
        poVar4 = local_68->precincts;
        OVar15 = poVar4[uVar2].ch * poVar4[uVar2].cw;
        pOVar26 = &(poVar4[uVar2].cblks.enc)->numpasses;
        for (OVar17 = 0; OVar15 != OVar17; OVar17 = OVar17 + 1) {
          if ((*pOVar26 == 0) && ((*(opj_tcd_layer_t **)(pOVar26 + -0xb))[uVar13].numpasses != 0)) {
            opj_tgt_setvalue(poVar4[uVar2].incltree,OVar17,uVar19);
          }
          pOVar26 = pOVar26 + 0x10;
        }
        local_b0 = poVar4[uVar2].cblks.enc;
        for (OVar17 = 0; OVar17 != OVar15; OVar17 = OVar17 + 1) {
          poVar20 = local_b0->layers + uVar13;
          if (local_b0->numpasses == 0) {
            opj_tgt_encode(bio,poVar4[uVar2].incltree,OVar17,uVar19 + 1);
          }
          else {
            opj_bio_write(bio,(uint)(poVar20->numpasses != 0),1);
          }
          uVar9 = poVar20->numpasses;
          if (uVar9 != 0) {
            if (local_b0->numpasses == 0) {
              local_b0->numlenbits = 3;
              opj_tgt_encode(bio,poVar4[uVar2].imsbtree,OVar17,999);
              uVar9 = poVar20->numpasses;
            }
            OVar16 = 1;
            if (uVar9 == 2) {
              OVar16 = 2;
              OVar18 = 2;
LAB_00131915:
              opj_bio_write(bio,OVar18,OVar16);
            }
            else {
              if (uVar9 == 1) {
                OVar18 = 0;
                goto LAB_00131915;
              }
              if (uVar9 < 6) {
                OVar18 = uVar9 - 3 | 0xc;
                OVar16 = 4;
                goto LAB_00131915;
              }
              if (uVar9 < 0x25) {
                OVar18 = uVar9 - 6 | 0x1e0;
                OVar16 = 9;
                goto LAB_00131915;
              }
              if (uVar9 < 0xa5) {
                OVar18 = uVar9 - 0x25 | 0xff80;
                OVar16 = 0x10;
                goto LAB_00131915;
              }
            }
            uVar12 = (ulong)local_b0->numpasses;
            OVar16 = poVar20->numpasses;
            uVar9 = OVar16 + local_b0->numpasses;
            pbVar22 = &local_b0->passes[uVar12].field_0x14;
            iVar21 = 0;
            iVar24 = 0;
            OVar18 = 0;
            while( true ) {
              OVar16 = OVar16 - 1;
              iVar7 = iVar21;
              if (uVar9 <= (uint)uVar12) break;
              iVar24 = iVar24 + 1;
              OVar18 = OVar18 + *(int *)(pbVar22 + -4);
              if ((OVar16 == 0) || ((*pbVar22 & 1) != 0)) {
                OVar10 = opj_int_floorlog2(OVar18);
                OVar18 = local_b0->numlenbits;
                OVar11 = opj_int_floorlog2(iVar24);
                iVar24 = (OVar10 - (OVar11 + OVar18)) + 1;
                if (iVar21 <= iVar24) {
                  iVar21 = iVar24;
                }
                iVar24 = 0;
                OVar18 = 0;
              }
              uVar12 = (ulong)((uint)uVar12 + 1);
              pbVar22 = pbVar22 + 0x18;
            }
            for (; 0 < iVar7; iVar7 = iVar7 + -1) {
              opj_bio_write(bio,1,1);
            }
            opj_bio_write(bio,0,1);
            local_b0->numlenbits = local_b0->numlenbits + iVar21;
            uVar12 = (ulong)local_b0->numpasses;
            pbVar22 = &local_b0->passes[uVar12].field_0x14;
            while (uVar27 = (uint)uVar12, uVar27 < uVar9) {
              iVar24 = iVar24 + 1;
              OVar18 = OVar18 + *(int *)(pbVar22 + -4);
              if (((*pbVar22 & 1) != 0) ||
                 (uVar27 == (local_b0->numpasses + poVar20->numpasses) - 1)) {
                OVar16 = local_b0->numlenbits;
                OVar10 = opj_int_floorlog2(iVar24);
                opj_bio_write(bio,OVar18,OVar16 + OVar10);
                iVar24 = 0;
                OVar18 = 0;
              }
              pbVar22 = pbVar22 + 0x18;
              uVar12 = (ulong)(uVar27 + 1);
            }
          }
          local_b0 = local_b0 + 1;
        }
      }
      local_68 = local_68 + 1;
    }
    OVar8 = opj_bio_flush(bio);
    if (OVar8 != 0) {
      uVar12 = opj_bio_numbytes(bio);
      local_c8 = local_c8 + (uVar12 & 0xffffffff);
      uVar19 = length - (int)uVar12;
      opj_bio_destroy(bio);
      if ((tcp->csty & 4) != 0) {
        uVar14 = (ulong)uVar19;
        if (uVar19 < 2) {
          if (p_t2_mode != FINAL_PASS) {
            return 0;
          }
          uVar12 = 2;
LAB_00131d34:
          opj_event_msg(p_manager,1,
                        "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                        ,uVar14,uVar12);
          return 0;
        }
        local_c8[0] = 0xff;
        local_c8[1] = 0x92;
        local_c8 = local_c8 + 2;
        uVar19 = uVar19 - 2;
      }
      uVar14 = (ulong)uVar19;
      local_78 = (int)dest;
      if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
        cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos =
             (long)((int)local_c8 - local_78);
      }
      uVar19 = 0;
      do {
        if (poVar3[uVar1].numbands <= uVar19) {
          if (local_c8 < dest) {
            __assert_fail("c >= dest",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t2.c"
                          ,0x3bb,
                          "OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32, opj_tcd_tile_t *, opj_tcp_t *, opj_pi_iterator_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, J2K_T2_MODE, opj_event_mgr_t *)"
                         );
          }
          *p_data_written = *p_data_written + ((int)local_c8 - local_78);
          return 1;
        }
        OVar8 = opj_tcd_is_band_empty(local_70);
        if (OVar8 == 0) {
          poVar4 = local_70->precincts;
          iVar21 = poVar4[uVar2].ch * poVar4[uVar2].cw;
          pOVar26 = &(poVar4[uVar2].cblks.enc)->numpasses;
          while (bVar28 = iVar21 != 0, iVar21 = iVar21 + -1, bVar28) {
            if ((*(opj_tcd_layer_t **)(pOVar26 + -0xb))[uVar13].numpasses != 0) {
              poVar20 = *(opj_tcd_layer_t **)(pOVar26 + -0xb) + uVar13;
              uVar12 = (ulong)poVar20->len;
              if ((uint)uVar14 < poVar20->len) {
                if (p_t2_mode != FINAL_PASS) {
                  return 0;
                }
                goto LAB_00131d34;
              }
              memcpy(local_c8,poVar20->data,uVar12);
              *pOVar26 = *pOVar26 + poVar20->numpasses;
              local_c8 = local_c8 + poVar20->len;
              uVar14 = (ulong)((uint)uVar14 - poVar20->len);
              if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                poVar6 = cstr_info->tile[tileno].packet;
                dVar29 = (double)poVar20->disto + poVar6[cstr_info->packno].disto;
                poVar6[cstr_info->packno].disto = dVar29;
                if (cstr_info->D_max <= dVar29 && dVar29 != cstr_info->D_max) {
                  cstr_info->D_max = dVar29;
                }
              }
            }
            pOVar26 = pOVar26 + 0x10;
          }
        }
        uVar19 = uVar19 + 1;
        local_70 = local_70 + 1;
      } while( true );
    }
    opj_bio_destroy(bio);
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32 tileno,
                                     opj_tcd_tile_t * tile,
                                     opj_tcp_t * tcp,
                                     opj_pi_iterator_t *pi,
                                     OPJ_BYTE *dest,
                                     OPJ_UINT32 * p_data_written,
                                     OPJ_UINT32 length,
                                     opj_codestream_info_t *cstr_info,
                                     J2K_T2_MODE p_t2_mode,
                                     opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 bandno, cblkno;
    OPJ_BYTE* c = dest;
    OPJ_UINT32 l_nb_bytes;
    OPJ_UINT32 compno = pi->compno;     /* component value */
    OPJ_UINT32 resno  = pi->resno;      /* resolution level value */
    OPJ_UINT32 precno = pi->precno;     /* precinct value */
    OPJ_UINT32 layno  = pi->layno;      /* quality layer value */
    OPJ_UINT32 l_nb_blocks;
    opj_tcd_band_t *band = 00;
    opj_tcd_cblk_enc_t* cblk = 00;
    opj_tcd_pass_t *pass = 00;

    opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
    opj_tcd_resolution_t *res = &tilec->resolutions[resno];

    opj_bio_t *bio = 00;    /* BIO component */
#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    OPJ_BOOL packet_empty = OPJ_TRUE;
#else
    OPJ_BOOL packet_empty = OPJ_FALSE;
#endif

    /* <SOP 0xff91> */
    if (tcp->csty & J2K_CP_CSTY_SOP) {
        if (length < 6) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 6);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 145;
        c[2] = 0;
        c[3] = 4;
#if 0
        c[4] = (tile->packno % 65536) / 256;
        c[5] = (tile->packno % 65536) % 256;
#else
        c[4] = (tile->packno >> 8) & 0xff; /* packno is uint32_t */
        c[5] = tile->packno & 0xff;
#endif
        c += 6;
        length -= 6;
    }
    /* </SOP> */

    if (!layno) {
        band = res->bands;

        for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
            opj_tcd_precinct_t *prc;

            /* Skip empty bands */
            if (opj_tcd_is_band_empty(band)) {
                continue;
            }

            prc = &band->precincts[precno];
            opj_tgt_reset(prc->incltree);
            opj_tgt_reset(prc->imsbtree);

            l_nb_blocks = prc->cw * prc->ch;
            for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
                cblk = &prc->cblks.enc[cblkno];

                cblk->numpasses = 0;
                opj_tgt_setvalue(prc->imsbtree, cblkno, band->numbps - (OPJ_INT32)cblk->numbps);
            }
        }
    }

    bio = opj_bio_create();
    if (!bio) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    opj_bio_init_enc(bio, c, length);

#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    /* WARNING: this code branch is disabled, since it has been reported that */
    /* such packets cause decoding issues with cinema J2K hardware */
    /* decoders: https://groups.google.com/forum/#!topic/openjpeg/M7M_fLX_Bco */

    /* Check if the packet is empty */
    /* Note: we could also skip that step and always write a packet header */
    band = res->bands;
    for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
        opj_tcd_precinct_t *prc;
        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++, ++cblk) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                continue;
            }
            packet_empty = OPJ_FALSE;
            break;
        }
        if (!packet_empty) {
            break;
        }
    }
#endif
    opj_bio_write(bio, packet_empty ? 0 : 1, 1);           /* Empty header bit */

    /* Writing Packet header */
    band = res->bands;
    for (bandno = 0; !packet_empty &&
            bandno < res->numbands; ++bandno, ++band)      {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!cblk->numpasses && layer->numpasses) {
                opj_tgt_setvalue(prc->incltree, cblkno, (OPJ_INT32)layno);
            }

            ++cblk;
        }

        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];
            OPJ_UINT32 increment = 0;
            OPJ_UINT32 nump = 0;
            OPJ_UINT32 len = 0, passno;
            OPJ_UINT32 l_nb_passes;

            /* cblk inclusion bits */
            if (!cblk->numpasses) {
                opj_tgt_encode(bio, prc->incltree, cblkno, (OPJ_INT32)(layno + 1));
            } else {
                opj_bio_write(bio, layer->numpasses != 0, 1);
            }

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            /* if first instance of cblk --> zero bit-planes information */
            if (!cblk->numpasses) {
                cblk->numlenbits = 3;
                opj_tgt_encode(bio, prc->imsbtree, cblkno, 999);
            }

            /* number of coding passes included */
            opj_t2_putnumpasses(bio, layer->numpasses);
            l_nb_passes = cblk->numpasses + layer->numpasses;
            pass = cblk->passes +  cblk->numpasses;

            /* computation of the increase of the length indicator and insertion in the header     */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                ++nump;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    increment = (OPJ_UINT32)opj_int_max((OPJ_INT32)increment,
                                                        opj_int_floorlog2((OPJ_INT32)len) + 1
                                                        - ((OPJ_INT32)cblk->numlenbits + opj_int_floorlog2((OPJ_INT32)nump)));
                    len = 0;
                    nump = 0;
                }

                ++pass;
            }
            opj_t2_putcommacode(bio, (OPJ_INT32)increment);

            /* computation of the new Length indicator */
            cblk->numlenbits += increment;

            pass = cblk->passes +  cblk->numpasses;
            /* insertion of the codeword segment length */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                nump++;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    opj_bio_write(bio, (OPJ_UINT32)len,
                                  cblk->numlenbits + (OPJ_UINT32)opj_int_floorlog2((OPJ_INT32)nump));
                    len = 0;
                    nump = 0;
                }
                ++pass;
            }

            ++cblk;
        }
    }

    if (!opj_bio_flush(bio)) {
        opj_bio_destroy(bio);
        return OPJ_FALSE;               /* modified to eliminate longjmp !! */
    }

    l_nb_bytes = (OPJ_UINT32)opj_bio_numbytes(bio);
    c += l_nb_bytes;
    length -= l_nb_bytes;

    opj_bio_destroy(bio);

    /* <EPH 0xff92> */
    if (tcp->csty & J2K_CP_CSTY_EPH) {
        if (length < 2) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 2);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 146;
        c += 2;
        length -= 2;
    }
    /* </EPH> */

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
       Will be updated later by incrementing with packet start value*/
    if (cstr_info && cstr_info->index_write) {
        opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
        info_PK->end_ph_pos = (OPJ_INT32)(c - dest);
    }
    /* INDEX >> */

    /* Writing the packet body */
    band = res->bands;
    for (bandno = 0; !packet_empty && bandno < res->numbands; bandno++, ++band) {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            if (layer->len > length) {
                if (p_t2_mode == FINAL_PASS) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "opj_t2_encode_packet(): only %u bytes remaining in "
                                  "output buffer. %u needed.\n",
                                  length, layer->len);
                }
                return OPJ_FALSE;
            }

            memcpy(c, layer->data, layer->len);
            cblk->numpasses += layer->numpasses;
            c += layer->len;
            length -= layer->len;

            /* << INDEX */
            if (cstr_info && cstr_info->index_write) {
                opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
                info_PK->disto += layer->disto;
                if (cstr_info->D_max < info_PK->disto) {
                    cstr_info->D_max = info_PK->disto;
                }
            }

            ++cblk;
            /* INDEX >> */
        }
    }

    assert(c >= dest);
    * p_data_written += (OPJ_UINT32)(c - dest);

    return OPJ_TRUE;
}